

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

JSON JSON::makeArray(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  JSON JVar1;
  unique_ptr<JSON::JSON_array,_std::default_delete<JSON::JSON_array>_> local_20;
  unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_> local_18 [2];
  
  std::make_unique<JSON::JSON_array>();
  std::unique_ptr<JSON::JSON_value,std::default_delete<JSON::JSON_value>>::
  unique_ptr<JSON::JSON_array,std::default_delete<JSON::JSON_array>,void>
            ((unique_ptr<JSON::JSON_value,std::default_delete<JSON::JSON_value>> *)local_18,
             &local_20);
  JSON((JSON *)in_RDI,local_18);
  std::unique_ptr<JSON::JSON_value,_std::default_delete<JSON::JSON_value>_>::~unique_ptr(local_18);
  std::unique_ptr<JSON::JSON_array,_std::default_delete<JSON::JSON_array>_>::~unique_ptr(&local_20);
  JVar1.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  JVar1.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (JSON)JVar1.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

JSON
JSON::makeArray()
{
    return {std::make_unique<JSON_array>()};
}